

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t roaring64_bitmap_portable_size_in_bytes(roaring64_bitmap_t *r)

{
  int iVar1;
  art_ref_t ref;
  ulong uVar2;
  container_t *pcVar3;
  uint uVar4;
  roaring_array_t *ra;
  size_t sVar5;
  ulong uVar6;
  uint32_t cap;
  uint uVar7;
  art_iterator_t it;
  art_iterator_t it2;
  size_t local_160;
  art_iterator_t local_150;
  art_iterator_t local_c0;
  
  memset(&local_150,0,0x90);
  ref = (r->art).root;
  local_150.art = &r->art;
  if (ref != 0) {
    art_node_init_iterator(ref,&local_150,true);
  }
  uVar4 = 0;
  if (local_150.value == (ulong *)0x0) {
    local_160 = 8;
    ra = (roaring_array_t *)0x0;
  }
  else {
    local_160 = 8;
    ra = (roaring_array_t *)0x0;
    do {
      uVar6 = (ulong)(uint)local_150.key._0_4_;
      uVar6 = (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28 |
              uVar6 << 0x38;
      uVar7 = (uint)(uVar6 >> 0x20);
      if ((ra == (roaring_array_t *)0x0) || (uVar4 != uVar7)) {
        if (ra != (roaring_array_t *)0x0) {
          sVar5 = ra_portable_size_in_bytes(ra);
          local_160 = local_160 + sVar5 + 4;
          (*global_memory_hook.free)(ra->containers);
          ra->keys = (uint16_t *)0x0;
          ra->typecodes = (uint8_t *)0x0;
          ra->size = 0;
          ra->allocation_size = 0;
          ra->containers = (void **)0x0;
          (*global_memory_hook.free)(ra);
        }
        memcpy(&local_c0,&local_150,0x90);
        if (local_c0.value == (art_val_t *)0x0) {
          cap = 0;
        }
        else {
          cap = 0;
          do {
            if (uVar7 != ((uint)local_c0.key._0_4_ >> 0x18 | (uint)local_c0.key._0_4_ >> 8 & 0xff00
                          | (uint)((((ulong)(uint)local_c0.key._0_4_ & 0xff00) << 0x28) >> 0x20) |
                         (uint)(((ulong)(uint)local_c0.key._0_4_ << 0x38) >> 0x20))) break;
            cap = cap + 1;
            art_iterator_move(&local_c0,true);
          } while (local_c0.value != (art_val_t *)0x0);
        }
        ra = &roaring_bitmap_create_with_capacity(cap)->high_low_container;
        uVar4 = uVar7;
      }
      uVar2 = *local_150.value;
      pcVar3 = r->containers[uVar2 >> 8];
      extend_array(ra,1);
      iVar1 = ra->size;
      ra->keys[iVar1] = (uint16_t)(uVar6 >> 0x30);
      ra->containers[iVar1] = pcVar3;
      ra->typecodes[iVar1] = (uint8_t)uVar2;
      ra->size = ra->size + 1;
      art_iterator_move(&local_150,true);
    } while (local_150.value != (ulong *)0x0);
  }
  if (ra != (roaring_array_t *)0x0) {
    sVar5 = ra_portable_size_in_bytes(ra);
    local_160 = local_160 + sVar5 + 4;
    (*global_memory_hook.free)(ra->containers);
    ra->keys = (uint16_t *)0x0;
    ra->typecodes = (uint8_t *)0x0;
    ra->size = 0;
    ra->allocation_size = 0;
    ra->containers = (void **)0x0;
    (*global_memory_hook.free)(ra);
  }
  return local_160;
}

Assistant:

size_t roaring64_bitmap_portable_size_in_bytes(const roaring64_bitmap_t *r) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    size_t size = 0;

    // Write as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t high32_count;
    size += sizeof(high32_count);

    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    uint32_t prev_high32 = 0;
    roaring_bitmap_t *bitmap32 = NULL;

    // Iterate through buckets ordered by increasing keys.
    while (it.value != NULL) {
        uint32_t current_high32 = (uint32_t)(combine_key(it.key, 0) >> 32);
        if (bitmap32 == NULL || prev_high32 != current_high32) {
            if (bitmap32 != NULL) {
                // Write as uint32 the most significant 32 bits of the
                // bucket.
                size += sizeof(prev_high32);

                // Write the 32-bit Roaring bitmaps representing the least
                // significant bits of a set of elements.
                size += roaring_bitmap_portable_size_in_bytes(bitmap32);
                roaring_bitmap_free_without_containers(bitmap32);
            }

            // Start a new 32-bit bitmap with the current high 32 bits.
            art_iterator_t it2 = it;
            uint32_t containers_with_high32 = 0;
            while (it2.value != NULL && (uint32_t)(combine_key(it2.key, 0) >>
                                                   32) == current_high32) {
                containers_with_high32++;
                art_iterator_next(&it2);
            }
            bitmap32 =
                roaring_bitmap_create_with_capacity(containers_with_high32);

            prev_high32 = current_high32;
        }
        leaf_t leaf = (leaf_t)*it.value;
        ra_append(&bitmap32->high_low_container,
                  (uint16_t)(current_high32 >> 16), get_container(r, leaf),
                  get_typecode(leaf));
        art_iterator_next(&it);
    }

    if (bitmap32 != NULL) {
        // Write as uint32 the most significant 32 bits of the bucket.
        size += sizeof(prev_high32);

        // Write the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size += roaring_bitmap_portable_size_in_bytes(bitmap32);
        roaring_bitmap_free_without_containers(bitmap32);
    }

    return size;
}